

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var Js::InterpreterStackFrame::InterpreterHelper
              (ScriptFunction *function,ArgumentReader *args,void *returnAddress,
              void *addressOfReturnAddress,AsmJsReturnStruct *asmJsReturn)

{
  uint uVar1;
  Var *ppvVar2;
  ExecutionInfoManager *pEVar3;
  code *pcVar4;
  undefined8 uVar5;
  byte bVar6;
  ArenaAllocator *stackAllocation_00;
  Var *ppvVar7;
  DWORD_PTR __n;
  bool bVar8;
  ImplicitCallFlags flags;
  ScriptContext *this;
  ThreadContext *this_00;
  undefined4 *puVar9;
  long lVar10;
  ArenaAllocator *__s;
  size_t *psVar11;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar12;
  PVOID unaff_retaddr;
  undefined *puStack_350;
  undefined1 auStack_348 [56];
  double local_310;
  int64 local_308;
  int local_300;
  undefined1 local_2f9;
  Var local_2f8;
  Var local_2f0;
  undefined1 local_2e3;
  undefined1 local_2e2;
  undefined1 local_2e1;
  JavascriptGenerator *local_2e0;
  byte local_2d1;
  Var *local_2d0;
  ArenaAllocator *local_2c8;
  bool local_2b9;
  LoopHeader *local_2b8;
  undefined1 local_2a9;
  ThreadContext *local_2a8;
  ThreadContext *local_2a0;
  Var *local_298;
  undefined1 local_289;
  size_t local_288;
  size_t local_280;
  JavascriptGenerator *local_278;
  Var local_270;
  JavascriptGenerator *local_268;
  RegSlot local_25c;
  JavascriptGenerator *local_258;
  JavascriptGenerator *local_250;
  Var local_248;
  undefined1 local_23d;
  CallFlags local_23c;
  undefined1 local_236;
  undefined1 local_235;
  BOOL local_234;
  uint *local_230;
  uint *local_228;
  uint32 local_21c;
  DynamicProfileInfo *local_218;
  undefined1 local_209;
  uint32 local_208;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  Utf8SourceInfo *local_200;
  uint local_1f8;
  undefined1 local_1f2;
  undefined1 local_1f1;
  FunctionBody *local_1f0;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  ScriptContext *local_1e0;
  BOOL local_1d8;
  undefined1 local_1d2;
  undefined1 local_1d1;
  ThreadContext *local_1d0;
  ScriptContext *local_1c8;
  ScriptContext *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  Arguments *local_1a8;
  undefined1 local_199;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 local_198;
  undefined1 local_188 [8];
  PushPopFrameHelper pushPopFrameHelper_1;
  PushPopFrameHelper pushPopFrameHelper;
  Var aReturn;
  undefined1 local_148 [7];
  bool isInFinally;
  TTDExceptionFramePopper exceptionFramePopper;
  RecyclableObject *invalidStackVar;
  LoopHeader *loopHeaderArray;
  size_t stackVarSizeInBytes;
  ArenaAllocator *tmpAlloc;
  Var *stackAllocation;
  Var *allocation;
  DWORD_PTR stackAddr;
  size_t varSizeInBytes;
  size_t stackVarAllocCount;
  size_t varAllocCount;
  Setup setup;
  JavascriptGenerator *generator;
  InterpreterStackFrame *newInstance;
  uint32 local_90;
  bool fReleaseAlloc;
  DynamicProfileInfo *pDStack_88;
  bool doProfile;
  DynamicProfileInfo *dynamicProfileInfo;
  AutoRestore autoRestore;
  FunctionBody *executeFunction;
  ThreadContext *threadContext;
  ScriptContext *functionScriptContext;
  InterpreterThunkStackCountTracker local_42;
  byte local_41;
  InterpreterThunkStackCountTracker tracker;
  AsmJsReturnStruct *pAStack_40;
  bool isAsmJs;
  AsmJsReturnStruct *asmJsReturn_local;
  void *addressOfReturnAddress_local;
  void *returnAddress_local;
  ArgumentReader *args_local;
  ScriptFunction *function_local;
  
  __s = (ArenaAllocator *)auStack_348;
  psVar11 = (size_t *)auStack_348;
  local_41 = asmJsReturn != (AsmJsReturnStruct *)0x0;
  puStack_350 = (undefined *)0xdc9a0a;
  local_1a8 = &args->super_Arguments;
  pAStack_40 = asmJsReturn;
  InterpreterThunkStackCountTracker::InterpreterThunkStackCountTracker(&local_42);
  puStack_350 = (undefined *)0xdc9a1b;
  local_199 = ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Configuration::Global,
                         InjectPartiallyInitializedInterpreterFrameErrorFlag);
  if ((bool)local_199) {
    local_1b0 = DAT_01ea9f28;
    puStack_350 = (undefined *)0xdc9a4a;
    local_1ac = InterpreterThunkStackCountTracker::GetCount();
    if (local_1b0 == local_1ac) {
      local_1b4 = DAT_01ea9f2c;
      if (DAT_01ea9f2c == 0) {
        puStack_350 = (undefined *)0xdc9a9e;
        DebugBreak();
      }
      else {
        if (DAT_01ea9f2c == 1) {
          puStack_350 = (undefined *)0xdc9aab;
          local_1c0 = RecyclableObject::GetScriptContext((RecyclableObject *)function);
          puStack_350 = &UNK_00dc9ac5;
          JavascriptError::MapAndThrowError(local_1c0,-0x7ff5ffcd);
        }
        puStack_350 = (undefined *)0xdc9acc;
        DebugBreak();
      }
    }
  }
  puStack_350 = (undefined *)0xdc9adb;
  this = RecyclableObject::GetScriptContext((RecyclableObject *)function);
  puStack_350 = (undefined *)0xdc9af8;
  local_1c8 = this;
  this_00 = ScriptContext::GetThreadContext(this);
  puStack_350 = (undefined *)0xdc9b15;
  local_1d0 = this_00;
  local_1d1 = ThreadContext::IsDisableImplicitException(this_00);
  if ((bool)local_1d1) {
    AssertCount = AssertCount + 1;
    puStack_350 = (undefined *)0xdc9b3b;
    Throw::LogAssert();
    puStack_350 = (undefined *)0xdc9b4d;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_350 = (undefined *)0xdc9b72;
    local_1d2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x791,"(!threadContext->IsDisableImplicitException())",
                                    "!threadContext->IsDisableImplicitException()");
    if (!(bool)local_1d2) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puStack_350 = (undefined *)0xdc9b98;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  puStack_350 = (undefined *)0xdc9bb6;
  local_1e0 = this;
  local_1d8 = RecyclableObject::IsExternal((RecyclableObject *)function);
  puStack_350 = (undefined *)0xdc9bdc;
  ScriptContext::VerifyAlive(local_1e0,(uint)(local_1d8 == 0),(ScriptContext *)0x0);
  puStack_350 = (undefined *)0xdc9be9;
  local_1e1 = ThreadContext::IsScriptActive(this_00);
  if (!(bool)local_1e1) {
    AssertCount = AssertCount + 1;
    puStack_350 = (undefined *)0xdc9c0f;
    Throw::LogAssert();
    puStack_350 = (undefined *)0xdc9c21;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_350 = (undefined *)0xdc9c46;
    local_1e2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x793,"(threadContext->IsScriptActive())",
                                    "threadContext->IsScriptActive()");
    if (!(bool)local_1e2) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puStack_350 = (undefined *)0xdc9c6c;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  puStack_350 = (undefined *)0xdc9c81;
  local_1e3 = ThreadContext::IsInScript(this_00);
  if (!(bool)local_1e3) {
    AssertCount = AssertCount + 1;
    puStack_350 = (undefined *)0xdc9ca7;
    Throw::LogAssert();
    puStack_350 = (undefined *)0xdc9cb9;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_350 = (undefined *)0xdc9cde;
    local_1e4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x794,"(threadContext->IsInScript())",
                                    "threadContext->IsInScript()");
    if (!(bool)local_1e4) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puStack_350 = (undefined *)0xdc9d04;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  puStack_350 = (undefined *)0xdc9d17;
  local_1f0 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  autoRestore._8_8_ = local_1f0;
  if ((local_41 & 1) == 0) {
    puStack_350 = (undefined *)0xdc9d3e;
    local_1f1 = FunctionProxy::IsInDebugMode((FunctionProxy *)local_1f0);
    local_1f8 = (uint)(byte)local_1f1;
    puStack_350 = (undefined *)0xdc9d61;
    local_1f2 = ScriptContext::IsScriptContextInDebugMode(this);
    if (local_1f8 != (byte)local_1f2) {
      puStack_350 = (undefined *)0xdc9d8c;
      local_200 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)autoRestore._8_8_);
      puStack_350 = (undefined *)0xdc9da1;
      local_201 = Utf8SourceInfo::GetIsLibraryCode(local_200);
      if (!(bool)local_201) {
        puStack_350 = &UNK_00dc9e5c;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      puStack_350 = (undefined *)0xdc9dc3;
      local_202 = FunctionProxy::IsInDebugMode((FunctionProxy *)autoRestore._8_8_);
      if ((bool)local_202) {
        AssertCount = AssertCount + 1;
        puStack_350 = (undefined *)0xdc9de9;
        Throw::LogAssert();
        puStack_350 = (undefined *)0xdc9dfb;
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        puStack_350 = (undefined *)0xdc9e20;
        local_203 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                        ,0x79c,"(!executeFunction->IsInDebugMode())",
                                        "!executeFunction->IsInDebugMode()");
        if (!(bool)local_203) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puStack_350 = (undefined *)0xdc9e46;
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
  }
  puStack_350 = (undefined *)0xdc9e69;
  local_208 = FunctionBody::GetInterpretedCount((FunctionBody *)autoRestore._8_8_);
  if (local_208 == 0) {
    puStack_350 = (undefined *)0xdc9e85;
    FunctionBody::TraceInterpreterExecutionMode((FunctionBody *)autoRestore._8_8_);
  }
  puStack_350 = (undefined *)0xdc9e9a;
  InterpreterHelper(Js::ScriptFunction*,Js::ArgumentReader,void*,void*,Js::InterpreterStackFrame::
  AsmJsReturnStruct*)::AutoRestore::AutoRestore(ThreadContext*,Js::FunctionBody__
            (&dynamicProfileInfo,this_00,(FunctionBody *)autoRestore._8_8_);
  pDStack_88 = (DynamicProfileInfo *)0x0;
  puStack_350 = (undefined *)0xdc9ead;
  local_209 = ShouldDoProfile((FunctionBody *)autoRestore._8_8_);
  fReleaseAlloc = (bool)local_209;
  if ((bool)local_209) {
    puStack_350 = (undefined *)0xdc9ed5;
    local_218 = FunctionBody::GetDynamicProfileInfo((FunctionBody *)autoRestore._8_8_);
    puStack_350 = (undefined *)0xdc9ef2;
    pDStack_88 = local_218;
    ThreadContext::ClearImplicitCallFlags(this_00);
  }
  puStack_350 = (undefined *)0xdc9f10;
  FunctionBody::IncreaseInterpretedCount((FunctionBody *)autoRestore._8_8_);
  this->interpretedCount = this->interpretedCount + 1;
  local_228 = &this->maxFuncInterpret;
  puStack_350 = (undefined *)0xdc9f3e;
  local_21c = FunctionBody::GetInterpretedCount((FunctionBody *)autoRestore._8_8_);
  puStack_350 = (undefined *)0xdc9f65;
  local_90 = local_21c;
  local_230 = max<unsigned_int>(local_228,&local_90);
  this->maxFuncInterpret = *local_230;
  puStack_350 = (undefined *)0xdc9f8a;
  local_234 = FunctionProxy::IsDeferredParseFunction((FunctionProxy *)autoRestore._8_8_);
  if (local_234 != 0) {
    AssertCount = AssertCount + 1;
    puStack_350 = (undefined *)0xdc9faf;
    Throw::LogAssert();
    puStack_350 = (undefined *)0xdc9fc1;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_350 = (undefined *)0xdc9fe6;
    local_235 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x7d8,"(!executeFunction->IsDeferredParseFunction())",
                                    "Non-intrinsic functions must provide byte-code to execute");
    if (!(bool)local_235) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puStack_350 = (undefined *)0xdca00c;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  puStack_350 = (undefined *)0xdca01f;
  FunctionBody::BeginExecution((FunctionBody *)autoRestore._8_8_);
  newInstance._7_1_ = false;
  if ((local_41 & 1) == 0) {
    puStack_350 = (undefined *)0xdca046;
    local_236 = FunctionProxy::IsCoroutine((FunctionProxy *)autoRestore._8_8_);
    if (!(bool)local_236) goto LAB_00dca232;
    if ((SUB84(((Arguments *)&local_1a8->Info)->Info,0) & 0xffffff) == 2) {
      puStack_350 = (undefined *)0xdca089;
      local_23c = Js::operator&((uint)(byte)(((Arguments *)&local_1a8->Info)->Info).field_0x3,
                                CallFlags_ExtraArg);
      if (local_23c != CallFlags_None) goto LAB_00dca09c;
    }
    else {
LAB_00dca09c:
      AssertCount = AssertCount + 1;
      puStack_350 = (undefined *)0xdca0ae;
      Throw::LogAssert();
      puStack_350 = (undefined *)0xdca0c0;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      puStack_350 = (undefined *)0xdca0e5;
      local_23d = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x7e7,
                                      "(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None))"
                                      ,
                                      "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                                     );
      if (!(bool)local_23d) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puStack_350 = (undefined *)0xdca10b;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puStack_350 = (undefined *)0xdca123;
    local_248 = Arguments::operator[](local_1a8,0);
    puStack_350 = (undefined *)0xdca138;
    local_250 = VarTo<Js::JavascriptGenerator>(local_248);
    puStack_350 = (undefined *)0xdca15b;
    setup._56_8_ = local_250;
    generator = (JavascriptGenerator *)JavascriptGenerator::GetFrame(local_250);
    local_258 = generator;
    if (generator == (JavascriptGenerator *)0x0) {
      puStack_350 = (undefined *)0xdca216;
      local_278 = (JavascriptGenerator *)
                  CreateInterpreterStackFrameForGenerator
                            (function,(FunctionBody *)autoRestore._8_8_,
                             (JavascriptGenerator *)setup._56_8_,(bool)(fReleaseAlloc & 1));
      generator = local_278;
    }
    else {
      puStack_350 = (undefined *)0xdca193;
      local_268 = generator;
      local_25c = FunctionBody::GetYieldRegister((FunctionBody *)autoRestore._8_8_);
      puStack_350 = (undefined *)0xdca1ac;
      local_270 = Arguments::operator[](local_1a8,1);
      puStack_350 = (undefined *)0xdca1ce;
      SetNonVarReg((InterpreterStackFrame *)local_268,local_25c,local_270);
      *(bool **)&generator[1].bailInSymbolsTraceArrayCount = &setup.bailedOut;
      *(undefined4 *)&generator[2].frame.ptr = 0;
      psVar11 = (size_t *)auStack_348;
    }
  }
  else {
LAB_00dca232:
    puStack_350 = (undefined *)0xdca252;
    Setup::Setup((Setup *)&varAllocCount,function,local_1a8,false,false,false);
    puStack_350 = (undefined *)0xdca260;
    local_280 = Setup::GetAllocationVarCount((Setup *)&varAllocCount);
    puStack_350 = (undefined *)0xdca283;
    stackVarAllocCount = local_280;
    local_288 = Setup::GetStackAllocationVarCount((Setup *)&varAllocCount);
    tmpAlloc = (ArenaAllocator *)0x0;
    varSizeInBytes = local_288;
    if (stackVarAllocCount + local_288 < 0x8001) {
      stackAddr = (stackVarAllocCount + local_288) * 8;
      puStack_350 = (undefined *)0xdca3e7;
      local_2a8 = ScriptContext::GetThreadContext(this);
      puStack_350 = (undefined *)0xdca412;
      ThreadContext::ProbeStack(local_2a8,stackAddr + 0x4000,this,unaff_retaddr);
      __n = stackAddr;
      lVar10 = -(stackAddr + 0xf & 0xfffffffffffffff0);
      __s = (ArenaAllocator *)(auStack_348 + lVar10);
      stackAllocation = (Var *)__s;
      *(undefined8 *)(auStack_348 + lVar10 + -8) = 0xdca44b;
      memset(__s,0xfe,__n);
      allocation = stackAllocation;
    }
    else {
      stackVarSizeInBytes = 0;
      puStack_350 = (undefined *)0xdca2da;
      newInstance._7_1_ =
           ScriptContext::EnsureInterpreterArena(this,(ArenaAllocator **)&stackVarSizeInBytes);
      stackAddr = stackVarAllocCount << 3;
      puStack_350 = (undefined *)0xdca325;
      local_289 = newInstance._7_1_;
      local_298 = (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                         ::AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          *)stackVarSizeInBytes,stackAddr);
      allocation = &stackAllocation;
      stackAllocation = local_298;
      if (varSizeInBytes != 0) {
        lVar10 = varSizeInBytes * 8;
        puStack_350 = (undefined *)0xdca371;
        local_2a0 = ScriptContext::GetThreadContext(this);
        puStack_350 = (undefined *)0xdca39c;
        ThreadContext::ProbeStack(local_2a0,lVar10 + 0x4000,this,unaff_retaddr);
        __s = (ArenaAllocator *)(auStack_348 + -(lVar10 + 0xfU & 0xfffffffffffffff0));
        tmpAlloc = __s;
      }
    }
    uVar5 = autoRestore._8_8_;
    invalidStackVar = (RecyclableObject *)0x0;
    __s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
         (void *)0xdca46d;
    local_2a9 = FunctionBody::GetHasAllocatedLoopHeaders((FunctionBody *)uVar5);
    uVar5 = autoRestore._8_8_;
    if ((bool)local_2a9) {
      __s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
           (void *)0xdca48a;
      local_2b8 = FunctionBody::GetLoopHeaderArrayPtr((FunctionBody *)uVar5);
      invalidStackVar = (RecyclableObject *)local_2b8;
    }
    psVar11 = &__s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               freeListSize;
    exceptionFramePopper.m_function = (JavascriptFunction *)psVar11;
    *psVar11 = 0xfefefefefefefefe;
    __s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
         (void *)0xfefefefefefefefe;
    uVar5 = autoRestore._8_8_;
    local_2d0 = stackAllocation;
    local_2c8 = tmpAlloc;
    *(undefined8 *)
     &__s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
      needsDelayFreeList = 0xdca4e8;
    local_2b9 = ParseableFunctionInfo::GetHasImplicitArgIns((ParseableFunctionInfo *)uVar5);
    bVar8 = fReleaseAlloc;
    ppvVar7 = allocation;
    stackAllocation_00 = local_2c8;
    ppvVar2 = local_2d0;
    local_2d1 = 0;
    if (local_2b9) {
      local_2d1 = local_41 ^ 0xff;
    }
    bVar6 = local_2d1;
    *(JavascriptFunction **)
     &__s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
      needsDelayFreeList = exceptionFramePopper.m_function;
    __s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData =
         (ArenaMemoryData *)ppvVar7;
    __s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.name =
         (LPCWSTR)0xdca565;
    generator = (JavascriptGenerator *)
                Setup::InitializeAllocation
                          ((Setup *)&varAllocCount,ppvVar2,(Var *)stackAllocation_00,
                           (bool)(bVar6 & 1),(bool)(bVar8 & 1),(LoopHeader *)invalidStackVar,
                           (DWORD_PTR)
                           __s[-1].
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           memoryData,
                           *(Var *)&__s[-1].
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    .needsDelayFreeList);
    uVar5 = autoRestore._8_8_;
    local_2e0 = generator;
    *(undefined8 *)
     &__s[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
      needsDelayFreeList = 0xdca592;
    ByteCodeReader::Create((ByteCodeReader *)generator,(FunctionBody *)uVar5,0);
  }
  psVar11[-1] = 0xdca5a2;
  TTD::TTDExceptionFramePopper::TTDExceptionFramePopper((TTDExceptionFramePopper *)local_148);
  psVar11[-1] = 0xdca5ad;
  local_2e1 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(this);
  if ((bool)local_2e1) {
    psVar11[-1] = 0xdca5d5;
    bVar8 = TestFlags((InterpreterStackFrame *)generator,4);
    pEVar3 = this_00->TTDExecutionInfo;
    uVar1 = *(uint *)&local_1a8->Info;
    ppvVar2 = local_1a8->Values;
    local_2e2 = bVar8;
    psVar11[-1] = 0xdca61f;
    TTD::ExecutionInfoManager::PushCallEvent
              (pEVar3,(JavascriptFunction *)function,uVar1 & 0xffffff,ppvVar2,bVar8);
    pEVar3 = this_00->TTDExecutionInfo;
    psVar11[-1] = 0xdca63c;
    TTD::TTDExceptionFramePopper::PushInfo
              ((TTDExceptionFramePopper *)local_148,pEVar3,(JavascriptFunction *)function);
  }
  uVar5 = autoRestore._8_8_;
  if ((local_41 & 1) == 0) {
    psVar11[-1] = 0xdca66f;
    local_2e3 = FunctionProxy::IsInDebugMode((FunctionProxy *)uVar5);
    if ((bool)local_2e3) {
      psVar11[-1] = 0xdca69e;
      PushPopFrameHelper::PushPopFrameHelper
                ((PushPopFrameHelper *)&pushPopFrameHelper_1.m_isHiddenFrame,
                 (InterpreterStackFrame *)generator,returnAddress,addressOfReturnAddress);
      psVar11[-1] = 0xdca6ac;
      pushPopFrameHelper._16_8_ = DebugProcess((InterpreterStackFrame *)generator);
      local_2f0 = (Var)pushPopFrameHelper._16_8_;
      psVar11[-1] = 0xdca6cf;
      PushPopFrameHelper::~PushPopFrameHelper
                ((PushPopFrameHelper *)&pushPopFrameHelper_1.m_isHiddenFrame);
      goto LAB_00dca75c;
    }
  }
  psVar11[-1] = 0xdca70c;
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_188,(InterpreterStackFrame *)generator,returnAddress,
             addressOfReturnAddress);
  psVar11[-1] = 0xdca71a;
  pushPopFrameHelper._16_8_ = Process((InterpreterStackFrame *)generator);
  local_2f8 = (Var)pushPopFrameHelper._16_8_;
  psVar11[-1] = 0xdca73d;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_188);
LAB_00dca75c:
  uVar5 = autoRestore._8_8_;
  psVar11[-1] = 0xdca765;
  FunctionBody::EndExecution((FunctionBody *)uVar5);
  psVar11[-1] = 0xdca770;
  local_2f9 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(this);
  if ((bool)local_2f9) {
    psVar11[-1] = 0xdca790;
    TTD::TTDExceptionFramePopper::PopInfo((TTDExceptionFramePopper *)local_148);
    pEVar3 = this_00->TTDExecutionInfo;
    psVar11[-1] = 0xdca7ad;
    TTD::ExecutionInfoManager::PopCallEvent
              (pEVar3,(JavascriptFunction *)function,(Var)pushPopFrameHelper._16_8_);
  }
  aVar12.f64[1] = (Type)auStack_348._32_8_;
  aVar12.f64[0] = (Type)auStack_348._40_8_;
  if ((local_41 & 1) != 0) {
    psVar11[-1] = 0xdca7c9;
    local_300 = GetRegRawInt<int>((InterpreterStackFrame *)generator,0);
    pAStack_40->i = local_300;
    psVar11[-1] = 0xdca7eb;
    local_308 = GetRegRawInt64<int>((InterpreterStackFrame *)generator,0);
    pAStack_40->l = local_308;
    psVar11[-1] = 0xdca811;
    local_310 = GetRegRawDouble<int>((InterpreterStackFrame *)generator,0);
    pAStack_40->d = local_310;
    psVar11[-1] = 0xdca83a;
    auStack_348._52_4_ = GetRegRawFloat<int>((InterpreterStackFrame *)generator,0);
    pAStack_40->f = (float)auStack_348._52_4_;
    psVar11[-1] = 0xdca863;
    aVar12 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
             GetRegRawSimd<int>((InterpreterStackFrame *)generator,0);
    *(anon_union_16_9_4d7543c8_for__SIMDValue_0 *)(pAStack_40->simd).field_0.i32 = aVar12;
    local_198 = aVar12;
  }
  auStack_348._32_8_ = aVar12.i64[1];
  auStack_348._40_8_ = aVar12.i64[0];
  if (newInstance._7_1_ != false) {
    psVar11[-1] = 0xdca8bb;
    ScriptContext::ReleaseInterpreterArena(this);
    aVar12.i64[1] = auStack_348._32_8_;
    aVar12.i64[0] = auStack_348._40_8_;
  }
  auStack_348._32_8_ = aVar12.i64[1];
  auStack_348._40_8_ = aVar12.i64[0];
  if ((fReleaseAlloc & 1U) != 0) {
    auStack_348._16_8_ = pDStack_88;
    psVar11[-1] = 0xdca8dc;
    flags = ThreadContext::GetImplicitCallFlags(this_00);
    uVar5 = auStack_348._16_8_;
    auStack_348[0x1f] = flags;
    psVar11[-1] = 0xdca8f9;
    DynamicProfileInfo::RecordImplicitCallFlags((DynamicProfileInfo *)uVar5,flags);
    aVar12.i64[1] = auStack_348._32_8_;
    aVar12.i64[0] = auStack_348._40_8_;
  }
  auStack_348._32_8_ = aVar12.f64[1];
  auStack_348._40_8_ = aVar12.f64[0];
  auStack_348._8_8_ = pushPopFrameHelper._16_8_;
  psVar11[-1] = 0xdca917;
  TTD::TTDExceptionFramePopper::~TTDExceptionFramePopper((TTDExceptionFramePopper *)local_148);
  psVar11[-1] = 0xdca920;
  InterpreterHelper::AutoRestore::~AutoRestore((AutoRestore *)&dynamicProfileInfo);
  psVar11[-1] = 0xdca929;
  InterpreterThunkStackCountTracker::~InterpreterThunkStackCountTracker(&local_42);
  return (Var)auStack_348._8_8_;
}

Assistant:

Var InterpreterStackFrame::InterpreterHelper(ScriptFunction* function, ArgumentReader args, void* returnAddress, void* addressOfReturnAddress, AsmJsReturnStruct* asmJsReturn)
    {
        const bool isAsmJs = asmJsReturn != nullptr;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // Support for simulating partially initialized interpreter stack frame.
        InterpreterThunkStackCountTracker tracker;

        if (CONFIG_ISENABLED(InjectPartiallyInitializedInterpreterFrameErrorFlag) &&
            CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameError) == InterpreterThunkStackCountTracker::GetCount())
        {
            switch (CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameErrorType))
            {
            case 0:
                DebugBreak();
                break;
            case 1:
                Js::JavascriptError::MapAndThrowError(function->GetScriptContext(), VBSERR_InternalError);
                break;
            default:
                DebugBreak();
            }
        }
#endif
        ScriptContext* functionScriptContext = function->GetScriptContext();
        ThreadContext * threadContext = functionScriptContext->GetThreadContext();
        Assert(!threadContext->IsDisableImplicitException());
        functionScriptContext->VerifyAlive(!function->IsExternal());
        Assert(threadContext->IsScriptActive());
        Assert(threadContext->IsInScript());

        FunctionBody* executeFunction = function->GetFunctionBody();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (!isAsmJs && executeFunction->IsInDebugMode() != functionScriptContext->IsScriptContextInDebugMode()) // debug mode mismatch
        {
            if (executeFunction->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                Assert(!executeFunction->IsInDebugMode()); // Library script byteCode is never in debug mode
            }
            else
            {
                Throw::FatalInternalError();
            }
        }
#endif

        if (executeFunction->GetInterpretedCount() == 0)
        {
            executeFunction->TraceInterpreterExecutionMode();
        }


        class AutoRestore
        {
        private:
            ThreadContext * const threadContext;
            const uint8 savedLoopDepth;

        public:
            AutoRestore(ThreadContext *const threadContext, FunctionBody *const executeFunction)
                : threadContext(threadContext),
                savedLoopDepth(threadContext->LoopDepth())
            {
                if (savedLoopDepth != 0 && !executeFunction->GetIsAsmJsFunction())
                {
                    executeFunction->SetWasCalledFromLoop();
                }
            }

            ~AutoRestore()
            {
                threadContext->SetLoopDepth(savedLoopDepth);
            }
        } autoRestore(threadContext, executeFunction);

#if ENABLE_PROFILE_INFO
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        const bool doProfile = ShouldDoProfile(executeFunction);
        if (doProfile)
        {
#if !DYNAMIC_INTERPRETER_THUNK
            executeFunction->EnsureDynamicProfileInfo();
#endif
            dynamicProfileInfo = executeFunction->GetDynamicProfileInfo();
            threadContext->ClearImplicitCallFlags();
        }
#else
        const bool doProfile = false;
#endif

        executeFunction->IncreaseInterpretedCount();
#ifdef BGJIT_STATS
        functionScriptContext->interpretedCount++;
        functionScriptContext->maxFuncInterpret = max(functionScriptContext->maxFuncInterpret, executeFunction->GetInterpretedCount());
#endif

        AssertMsg(!executeFunction->IsDeferredParseFunction(),
            "Non-intrinsic functions must provide byte-code to execute");

        executeFunction->BeginExecution();

        bool fReleaseAlloc = false;
        InterpreterStackFrame* newInstance = nullptr;

        if (!isAsmJs && executeFunction->IsCoroutine())
        {
            // If the FunctionBody is a generator then this call is being made by one of the three
            // generator resuming methods: next(), throw(), or return().  They all pass the generator
            // object as the first of two arguments.  The real user arguments are obtained from the
            // generator object.  The second argument is the resume yield object which is only needed
            // when resuming a generator and so it is only used here if a frame already exists on the
            // generator object.
            AssertOrFailFastMsg(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None), "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");

            JavascriptGenerator* generator = VarTo<JavascriptGenerator>(args[0]);
            newInstance = generator->GetFrame();

            if (newInstance != nullptr)
            {
                newInstance->SetNonVarReg(executeFunction->GetYieldRegister(), args[1]);

                // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
                // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
                newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

                newInstance->retOffset = 0;
            }
            else
            {
                newInstance = CreateInterpreterStackFrameForGenerator(function, executeFunction, generator, doProfile);
            }
        }
        else
        {
            InterpreterStackFrame::Setup setup(function, args);
            size_t varAllocCount = setup.GetAllocationVarCount();
            size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
            size_t varSizeInBytes;

            //
            // Allocate a new InterpreterStackFrame instance on the interpreter's virtual stack.
            //
            DWORD_PTR stackAddr;

            Var* allocation;
            Var* stackAllocation = nullptr;

            // If the locals area exceeds a certain limit, allocate it from a private arena rather than
            // this frame. The current limit is based on an old assert on the number of locals we would allow here.
            if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
            {
                ArenaAllocator *tmpAlloc = nullptr;
                fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
                varSizeInBytes = varAllocCount * sizeof(Var);
                allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
                stackAddr = reinterpret_cast<DWORD_PTR>(&allocation); // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
                if (stackVarAllocCount != 0)
                {
                    size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                    PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                    stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
                }
            }
            else
            {
                varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes);
                allocation = (Var*)_alloca(varSizeInBytes);
#if DBG
                memset(allocation, 0xFE, varSizeInBytes);
#endif
                stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
            }

            /*
            * If the function has any loop headers, we allocate an array for the loop headers wrappers, and
            * reference the wrappers in the array. We then push the pointer to the array onto the stack itself.
            * We do this so that while the function is being interpreted, we don't want the jitted loop
            * bodies to be collected, even if the loop body isn't being executed. The loop body will
            * get collected when the function has been JITted, and when the function exits the interpreter.
            * The array contains nulls if the loop body isn't jitted (or hasn't been jitted yet) but
            * it's cheaper to just copy them all into the recycler array rather than just the ones that
            * have been jitted.
            */
            LoopHeader* loopHeaderArray = nullptr;

            if (executeFunction->GetHasAllocatedLoopHeaders())
            {
                // Loop header array is recycler allocated, so we push it on the stack
                // When we scan the stack, we'll recognize it as a recycler allocated
                // object, and mark it's contents and keep the individual loop header
                // wrappers alive
                loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
            }

#if DBG
            Js::RecyclableObject * invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
            memset(reinterpret_cast<void*>(invalidStackVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

            newInstance = setup.InitializeAllocation(allocation, stackAllocation, executeFunction->GetHasImplicitArgIns() && !isAsmJs, doProfile, loopHeaderArray, stackAddr
#if DBG
                , invalidStackVar
#endif
                );

            newInstance->m_reader.Create(executeFunction);
        }
        //
        // Execute the function's byte-code, returning the return-value:
        // - Mark that the function is current executing and may not be modified.
        //

#if ENABLE_TTD
        TTD::TTDExceptionFramePopper exceptionFramePopper;
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            bool isInFinally = newInstance->TestFlags(Js::InterpreterStackFrameFlags_WithinFinallyBlock);

            threadContext->TTDExecutionInfo->PushCallEvent(function, args.Info.Count, args.Values, isInFinally);
            exceptionFramePopper.PushInfo(threadContext->TTDExecutionInfo, function);
        }
#endif

        Var aReturn = nullptr;

        {
#ifdef ENABLE_SCRIPT_DEBUGGING
            if (!isAsmJs && executeFunction->IsInDebugMode())
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->DebugProcess();
#else
                aReturn = newInstance->DebugProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
            else
#endif
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->Process();
#else
                aReturn = newInstance->ProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
        }

        executeFunction->EndExecution();

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            exceptionFramePopper.PopInfo();
            threadContext->TTDExecutionInfo->PopCallEvent(function, aReturn);
        }
#endif

#ifdef ASMJS_PLAT
        if (isAsmJs)
        {
            asmJsReturn->i = newInstance->GetRegRawInt(0);
            asmJsReturn->l = newInstance->GetRegRawInt64(0);
            asmJsReturn->d = newInstance->GetRegRawDouble(0);
            asmJsReturn->f = newInstance->GetRegRawFloat(0);
            asmJsReturn->simd = newInstance->GetRegRawSimd(0);
        }
#endif

        if (fReleaseAlloc)
        {
            functionScriptContext->ReleaseInterpreterArena();
        }

#if ENABLE_PROFILE_INFO
        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
        }
#endif

        return aReturn;
    }